

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation_p.h
# Opt level: O0

QVariant * _q_interpolateVariant<QLine>(QLine *from,QLine *to,qreal progress)

{
  QLine l;
  QPoint in_RDI;
  QVariant *in_stack_ffffffffffffffb8;
  QPoint QVar1;
  undefined1 in_stack_ffffffffffffffd0 [16];
  
  QVar1 = in_RDI;
  _q_interpolate<QLine>
            (in_stack_ffffffffffffffd0._8_8_,in_stack_ffffffffffffffd0._0_8_,(qreal)in_RDI);
  l.pt2 = QVar1;
  l.pt1 = in_RDI;
  QVariant::QVariant(in_stack_ffffffffffffffb8,l);
  return (QVariant *)QVar1;
}

Assistant:

inline QVariant _q_interpolateVariant(const T &from, const T &to, qreal progress)
{
    return _q_interpolate(from, to, progress);
}